

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  char *zLeft;
  int iVar1;
  char *zName;
  int i;
  char *zOld_local;
  ExprList *pEList_local;
  RenameCtx *pCtx_local;
  Parse *pParse_local;
  
  if (pEList != (ExprList *)0x0) {
    for (zName._4_4_ = 0; zName._4_4_ < pEList->nExpr; zName._4_4_ = zName._4_4_ + 1) {
      zLeft = pEList->a[zName._4_4_].zEName;
      if ((((*(ushort *)&pEList->a[zName._4_4_].fg.field_0x1 & 3) == 0) && (zLeft != (char *)0x0))
         && (iVar1 = sqlite3_stricmp(zLeft,zOld), iVar1 == 0)) {
        renameTokenFind(pParse,pCtx,zLeft);
      }
    }
  }
  return;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const ExprList *pEList,
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      const char *zName = pEList->a[i].zEName;
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME)
       && ALWAYS(zName!=0)
       && 0==sqlite3_stricmp(zName, zOld)
      ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}